

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O3

void __thiscall
discordpp::field<discordpp::InstallParams>::field
          (field<discordpp::InstallParams> *this,field<discordpp::InstallParams> *f)

{
  _Head_base<0UL,_discordpp::InstallParams_*,_false> f_00;
  _Head_base<0UL,_discordpp::InstallParams_*,_false> this_00;
  
  f_00._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<discordpp::InstallParams,_std::default_delete<discordpp::InstallParams>_>
       ._M_t.
       super__Tuple_impl<0UL,_discordpp::InstallParams_*,_std::default_delete<discordpp::InstallParams>_>
       .super__Head_base<0UL,_discordpp::InstallParams_*,_false>._M_head_impl;
  if (f_00._M_head_impl == (InstallParams *)0x0) {
    this_00._M_head_impl = (InstallParams *)0x0;
  }
  else {
    this_00._M_head_impl = (InstallParams *)operator_new(0x20);
    field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::field((field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this_00._M_head_impl,&(f_00._M_head_impl)->scopes);
    field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
              (&(this_00._M_head_impl)->permissions,&(f_00._M_head_impl)->permissions);
  }
  (this->t_)._M_t.
  super___uniq_ptr_impl<discordpp::InstallParams,_std::default_delete<discordpp::InstallParams>_>.
  _M_t.
  super__Tuple_impl<0UL,_discordpp::InstallParams_*,_std::default_delete<discordpp::InstallParams>_>
  .super__Head_base<0UL,_discordpp::InstallParams_*,_false>._M_head_impl = this_00._M_head_impl;
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}